

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O0

int tnt_reload_schema(tnt_stream *s)

{
  anon_union_128_3_89b29c27_for_data *r_00;
  void *pvVar1;
  uint32_t uVar2;
  int iVar3;
  tnt_reply *r;
  undefined1 local_148 [4];
  int sloaded;
  tnt_reply bkp;
  tnt_iter it;
  uint64_t oldsync;
  tnt_stream_net *sn;
  tnt_stream *s_local;
  
  pvVar1 = s->data;
  if ((*(int *)((long)pvVar1 + 0x78) == 0) || (s->wrcnt != 0)) {
    s_local._4_4_ = -1;
  }
  else {
    uVar2 = tnt_stream_reqid(s,0x7f);
    it.data.reply.r.sqlinfo_end = (char *)(ulong)uVar2;
    tnt_get_space(s);
    tnt_get_index(s);
    tnt_stream_reqid(s,(uint32_t)it.data.reply.r.sqlinfo_end);
    tnt_flush(s);
    tnt_iter_reply((tnt_iter *)&bkp.sqlinfo_end,s);
    tnt_reply_init((tnt_reply *)local_148);
    r._4_4_ = 0;
    while (iVar3 = tnt_next((tnt_iter *)&bkp.sqlinfo_end), iVar3 != 0) {
      r_00 = &it.data;
      if (it.data.map.value_end == (char *)0x7f) {
        if (it.data.reply.r.schema_id != 0) goto LAB_0010feb3;
        tnt_schema_add_spaces(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)&r_00->array);
        r._4_4_ = r._4_4_ + 1;
      }
      else {
        if ((it.data.map.value_end != (char *)0x80) || (it.data.reply.r.schema_id != 0))
        goto LAB_0010feb3;
        if ((r._4_4_ & 1) == 0) {
          memcpy(local_148,r_00,0x78);
          it.data.array.elem = (char *)0x0;
        }
        else {
          r._4_4_ = r._4_4_ + 2;
          tnt_schema_add_indexes(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)&r_00->array);
        }
      }
    }
    if (bkp.bitmap != 0) {
      tnt_schema_add_indexes(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)local_148);
      r._4_4_ = r._4_4_ + 2;
      tnt_reply_free((tnt_reply *)local_148);
    }
    if (r._4_4_ == 3) {
      tnt_iter_free((tnt_iter *)&bkp.sqlinfo_end);
      s_local._4_4_ = 0;
    }
    else {
LAB_0010feb3:
      tnt_iter_free((tnt_iter *)&bkp.sqlinfo_end);
      s_local._4_4_ = -1;
    }
  }
  return s_local._4_4_;
}

Assistant:

int tnt_reload_schema(struct tnt_stream *s)
{
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if (!sn->connected || pm_atomic_load(&s->wrcnt) != 0)
		return -1;
	uint64_t oldsync = tnt_stream_reqid(s, 127);
	tnt_get_space(s);
	tnt_get_index(s);
	tnt_stream_reqid(s, oldsync);
	tnt_flush(s);
	struct tnt_iter it; tnt_iter_reply(&it, s);
	struct tnt_reply bkp; tnt_reply_init(&bkp);
	int sloaded = 0;
	while (tnt_next(&it)) {
		struct tnt_reply *r = TNT_IREPLY_PTR(&it);
		switch (r->sync) {
		case(127):
			if (r->error)
				goto error;
			tnt_schema_add_spaces(sn->schema, r);
			sloaded += 1;
			break;
		case(128):
			if (r->error)
				goto error;
			if (!(sloaded & 1)) {
				memcpy(&bkp, r, sizeof(struct tnt_reply));
				r->buf = NULL;
				break;
			}
			sloaded += 2;
			tnt_schema_add_indexes(sn->schema, r);
			break;
		default:
			goto error;
		}
	}
	if (bkp.buf) {
		tnt_schema_add_indexes(sn->schema, &bkp);
		sloaded += 2;
		tnt_reply_free(&bkp);
	}
	if (sloaded != 3) goto error;

	tnt_iter_free(&it);
	return 0;
error:
	tnt_iter_free(&it);
	return -1;
}